

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

float128 normalizeRoundAndPackFloat128
                   (flag zSign,int32_t zExp,uint64_t zSig0,uint64_t zSig1,float_status *status)

{
  long lVar1;
  uint64_t zSig0_00;
  byte bVar2;
  uint uVar3;
  int iVar4;
  uint64_t zSig1_00;
  int iVar5;
  float128 fVar6;
  uint64_t local_48;
  uint64_t zSig0_local;
  uint64_t local_38;
  
  local_48 = zSig1;
  zSig0_local = zSig0;
  if (zSig0 == 0) {
    local_48 = 0;
    zExp = zExp + -0x40;
    zSig0_local = zSig1;
  }
  if (zSig0_local == 0) {
    uVar3 = 0x40;
  }
  else {
    lVar1 = 0x3f;
    if (zSig0_local != 0) {
      for (; zSig0_local >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    uVar3 = (uint)lVar1 ^ 0x3f;
  }
  iVar4 = uVar3 * 0x1000000 + -0xf000000;
  iVar5 = iVar4 >> 0x18;
  if (iVar5 < 0) {
    shift128ExtraRightJamming(zSig0_local,local_48,0,-iVar5,&zSig0_local,&local_48,&local_38);
    zSig0_00 = zSig0_local;
    zSig1_00 = local_48;
  }
  else {
    bVar2 = (byte)((uint)iVar4 >> 0x18);
    zSig0_00 = zSig0_local;
    if (iVar4 != 0) {
      zSig0_00 = zSig0_local << (bVar2 & 0x3f) | local_48 >> (-bVar2 & 0x3f);
    }
    local_38 = 0;
    zSig1_00 = local_48 << (bVar2 & 0x3f);
  }
  fVar6 = roundAndPackFloat128(zSign,zExp - iVar5,zSig0_00,zSig1_00,local_38,status);
  return fVar6;
}

Assistant:

static float128 normalizeRoundAndPackFloat128(flag zSign, int32_t zExp,
                                              uint64_t zSig0, uint64_t zSig1,
                                              float_status *status)
{
    int8_t shiftCount;
    uint64_t zSig2;

    if ( zSig0 == 0 ) {
        zSig0 = zSig1;
        zSig1 = 0;
        zExp -= 64;
    }
    shiftCount = clz64(zSig0) - 15;
    if ( 0 <= shiftCount ) {
        zSig2 = 0;
        shortShift128Left( zSig0, zSig1, shiftCount, &zSig0, &zSig1 );
    }
    else {
        shift128ExtraRightJamming(
            zSig0, zSig1, 0, - shiftCount, &zSig0, &zSig1, &zSig2 );
    }
    zExp -= shiftCount;
    return roundAndPackFloat128(zSign, zExp, zSig0, zSig1, zSig2, status);

}